

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall
QAccessibleTable::modelChange(QAccessibleTable *this,QAccessibleTableModelChangeEvent *event)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  ModelChangeType MVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  long *plVar11;
  QAccessibleTableCellInterface *pQVar12;
  ulong uVar13;
  QAccessibleTableModelChangeEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAccessibleTableHeaderCell *cell_4;
  QAccessibleTableHeaderCell *cell_3;
  QAccessibleTableCell *cell_2;
  QAccessibleInterface *iface_1;
  int deletedRows;
  int deletedColumns;
  QAccessibleTableHeaderCell *cell_1;
  QAccessibleTableHeaderCell *cell;
  QAccessibleInterface *iface;
  int newColumns;
  int newRows;
  Id id;
  add_const_t<QHash<int,_unsigned_int>_> *__range2;
  Id id_2;
  ConstIterator iter_1;
  ChildCache newCache_1;
  Id id_1;
  ConstIterator iter;
  ChildCache newCache;
  const_iterator __end2;
  const_iterator __begin2;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  QAccessibleTableCellInterface *in_stack_fffffffffffffe68;
  QAccessibleTableCellInterface *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  QHash<int,_unsigned_int> local_60;
  undefined4 local_58;
  uint local_54;
  piter local_50;
  piter local_40;
  QHash<int,_unsigned_int> local_30;
  piter local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QHash<int,_unsigned_int>::isEmpty((QHash<int,_unsigned_int> *)(in_RDI + 4));
  if (!bVar3) {
    MVar4 = QAccessibleTableModelChangeEvent::modelChangeType(in_RSI);
    switch(MVar4) {
    case ModelReset:
      local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_18.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = (piter)QHash<int,_unsigned_int>::begin
                                  ((QHash<int,_unsigned_int> *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_28.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = (piter)QHash<int,_unsigned_int>::end
                                  ((QHash<int,_unsigned_int> *)in_stack_fffffffffffffe68);
      while (bVar3 = QHash<int,_unsigned_int>::const_iterator::operator!=
                               ((const_iterator *)in_stack_fffffffffffffe68,
                                (const_iterator *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)),
            bVar3) {
        puVar10 = QHash<int,_unsigned_int>::const_iterator::operator*((const_iterator *)0x7f6621);
        QAccessible::deleteAccessibleInterface(*puVar10);
        QHash<int,_unsigned_int>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffffe70);
      }
      QHash<int,_unsigned_int>::clear
                ((QHash<int,_unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      break;
    case DataChanged:
      break;
    case RowsInserted:
    case ColumnsInserted:
      iVar6 = QAccessibleTableModelChangeEvent::lastRow(in_RSI);
      iVar7 = QAccessibleTableModelChangeEvent::firstRow(in_RSI);
      iVar8 = QAccessibleTableModelChangeEvent::lastColumn(in_RSI);
      iVar9 = QAccessibleTableModelChangeEvent::firstColumn(in_RSI);
      local_30.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QHash<int,_unsigned_int>::QHash(&local_30);
      local_40.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_40.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = (piter)QHash<int,_unsigned_int>::constBegin
                                  ((QHash<int,_unsigned_int> *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      while( true ) {
        local_50 = (piter)QHash<int,_unsigned_int>::constEnd
                                    ((QHash<int,_unsigned_int> *)in_stack_fffffffffffffe68);
        bVar3 = QHash<int,_unsigned_int>::const_iterator::operator!=
                          ((const_iterator *)in_stack_fffffffffffffe68,
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        if (!bVar3) break;
        puVar10 = QHash<int,_unsigned_int>::const_iterator::value((const_iterator *)0x7f6759);
        local_54 = *puVar10;
        plVar11 = (long *)QAccessible::accessibleInterface(local_54);
        MVar4 = QAccessibleTableModelChangeEvent::modelChangeType(in_RSI);
        if ((MVar4 == RowsInserted) && (iVar5 = (**(code **)(*plVar11 + 0x78))(), iVar5 == 0x1a)) {
          lVar2 = plVar11[3];
          iVar5 = QAccessibleTableModelChangeEvent::firstRow(in_RSI);
          if (iVar5 <= (int)lVar2) {
            *(int *)(plVar11 + 3) = (iVar6 - iVar7) + 1 + (int)plVar11[3];
          }
        }
        else {
          MVar4 = QAccessibleTableModelChangeEvent::modelChangeType(in_RSI);
          if ((MVar4 == ColumnsInserted) &&
             ((iVar5 = (**(code **)(*plVar11 + 0x78))(), iVar5 == 0x19 &&
              (lVar2 = plVar11[3], iVar5 = QAccessibleTableModelChangeEvent::firstColumn(in_RSI),
              iVar5 <= (int)lVar2)))) {
            *(int *)(plVar11 + 3) = (iVar8 - iVar9) + 1 + (int)plVar11[3];
          }
        }
        iVar5 = (**(code **)(*in_RDI + 0xf0))(in_RDI,plVar11);
        if (iVar5 < 0) {
          QAccessible::deleteAccessibleInterface(local_54);
        }
        else {
          local_58 = (**(code **)(*in_RDI + 0xf0))(in_RDI,plVar11);
          QHash<int,_unsigned_int>::insert
                    ((QHash<int,_unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (uint *)0x7f68b1);
        }
        QHash<int,_unsigned_int>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffffe70);
      }
      QHash<int,_unsigned_int>::operator=
                ((QHash<int,_unsigned_int> *)in_stack_fffffffffffffe70,
                 (QHash<int,_unsigned_int> *)in_stack_fffffffffffffe68);
      QHash<int,_unsigned_int>::~QHash
                ((QHash<int,_unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      break;
    case RowsRemoved:
    case ColumnsRemoved:
      iVar6 = QAccessibleTableModelChangeEvent::lastColumn(in_RSI);
      iVar7 = QAccessibleTableModelChangeEvent::firstColumn(in_RSI);
      iVar7 = iVar6 - iVar7;
      iVar8 = QAccessibleTableModelChangeEvent::lastRow(in_RSI);
      iVar9 = QAccessibleTableModelChangeEvent::firstRow(in_RSI);
      iVar9 = iVar8 - iVar9;
      local_60.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QHash<int,_unsigned_int>::QHash(&local_60);
      QHash<int,_unsigned_int>::constBegin((QHash<int,_unsigned_int> *)CONCAT44(iVar8,iVar6));
      while( true ) {
        QHash<int,_unsigned_int>::constEnd((QHash<int,_unsigned_int> *)in_stack_fffffffffffffe68);
        bVar3 = QHash<int,_unsigned_int>::const_iterator::operator!=
                          ((const_iterator *)in_stack_fffffffffffffe68,
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        if (!bVar3) break;
        puVar10 = QHash<int,_unsigned_int>::const_iterator::value((const_iterator *)0x7f6a0a);
        uVar1 = *puVar10;
        plVar11 = (long *)QAccessible::accessibleInterface(uVar1);
        iVar6 = (**(code **)(*plVar11 + 0x78))();
        if ((iVar6 == 0x1d) || (iVar6 = (**(code **)(*plVar11 + 0x78))(), iVar6 == 0x22)) {
          in_stack_fffffffffffffe70 =
               QAccessibleInterface::tableCellInterface((QAccessibleInterface *)0x7f6a5e);
          if (in_stack_fffffffffffffe70 == (QAccessibleTableCellInterface *)0x0) {
            pQVar12 = (QAccessibleTableCellInterface *)0x0;
          }
          else {
            pQVar12 = in_stack_fffffffffffffe70 + -8;
          }
          in_stack_fffffffffffffe68 = pQVar12;
          uVar13 = QPersistentModelIndex::isValid();
          if ((uVar13 & 1) == 0) {
            QAccessible::deleteAccessibleInterface(uVar1);
          }
          else {
            (**(code **)(*in_RDI + 0xf0))(in_RDI,pQVar12);
            QHash<int,_unsigned_int>::insert
                      ((QHash<int,_unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (uint *)0x7f6ae0);
          }
        }
        else {
          MVar4 = QAccessibleTableModelChangeEvent::modelChangeType(in_RSI);
          if ((MVar4 == RowsRemoved) && (iVar6 = (**(code **)(*plVar11 + 0x78))(), iVar6 == 0x1a)) {
            in_stack_fffffffffffffe64 = (int)plVar11[3];
            iVar6 = QAccessibleTableModelChangeEvent::firstRow(in_RSI);
            if (in_stack_fffffffffffffe64 < iVar6) {
              (**(code **)(*in_RDI + 0xf0))(in_RDI,plVar11);
              QHash<int,_unsigned_int>::insert
                        ((QHash<int,_unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                         (uint *)0x7f6ba0);
            }
            else {
              in_stack_fffffffffffffe60 = (int)plVar11[3];
              iVar6 = QAccessibleTableModelChangeEvent::lastRow(in_RSI);
              if (iVar6 < in_stack_fffffffffffffe60) {
                *(int *)(plVar11 + 3) = (int)plVar11[3] - (iVar9 + 1);
                (**(code **)(*in_RDI + 0xf0))(in_RDI,plVar11);
                QHash<int,_unsigned_int>::insert
                          ((QHash<int,_unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           (uint *)0x7f6c2c);
              }
              else {
                QAccessible::deleteAccessibleInterface(uVar1);
              }
            }
          }
          else {
            MVar4 = QAccessibleTableModelChangeEvent::modelChangeType(in_RSI);
            if ((MVar4 == ColumnsRemoved) &&
               (iVar6 = (**(code **)(*plVar11 + 0x78))(), iVar6 == 0x19)) {
              in_stack_fffffffffffffe5c = (int)plVar11[3];
              iVar6 = QAccessibleTableModelChangeEvent::firstColumn(in_RSI);
              if (in_stack_fffffffffffffe5c < iVar6) {
                (**(code **)(*in_RDI + 0xf0))(in_RDI,plVar11);
                QHash<int,_unsigned_int>::insert
                          ((QHash<int,_unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           (uint *)0x7f6cdf);
              }
              else {
                in_stack_fffffffffffffe58 = (int)plVar11[3];
                iVar6 = QAccessibleTableModelChangeEvent::lastColumn(in_RSI);
                if (iVar6 < in_stack_fffffffffffffe58) {
                  *(int *)(plVar11 + 3) = (int)plVar11[3] - (iVar7 + 1);
                  (**(code **)(*in_RDI + 0xf0))(in_RDI,plVar11);
                  QHash<int,_unsigned_int>::insert
                            ((QHash<int,_unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                             (uint *)0x7f6d5a);
                }
                else {
                  QAccessible::deleteAccessibleInterface(uVar1);
                }
              }
            }
          }
        }
        QHash<int,_unsigned_int>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffffe70);
      }
      QHash<int,_unsigned_int>::operator=
                ((QHash<int,_unsigned_int> *)in_stack_fffffffffffffe70,
                 (QHash<int,_unsigned_int> *)in_stack_fffffffffffffe68);
      QHash<int,_unsigned_int>::~QHash
                ((QHash<int,_unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleTable::modelChange(QAccessibleTableModelChangeEvent *event)
{
    // if there is no cache yet, we don't update anything
    if (childToId.isEmpty())
        return;

    switch (event->modelChangeType()) {
    case QAccessibleTableModelChangeEvent::ModelReset:
        for (QAccessible::Id id : std::as_const(childToId))
            QAccessible::deleteAccessibleInterface(id);
        childToId.clear();
        break;

    // rows are inserted: move every row after that
    case QAccessibleTableModelChangeEvent::RowsInserted:
    case QAccessibleTableModelChangeEvent::ColumnsInserted: {
        int newRows = event->lastRow() - event->firstRow() + 1;
        int newColumns = event->lastColumn() - event->firstColumn() + 1;

        ChildCache newCache;
        ChildCache::ConstIterator iter = childToId.constBegin();

        while (iter != childToId.constEnd()) {
            QAccessible::Id id = iter.value();
            QAccessibleInterface *iface = QAccessible::accessibleInterface(id);
            Q_ASSERT(iface);
            if (event->modelChangeType() == QAccessibleTableModelChangeEvent::RowsInserted
                && iface->role() == QAccessible::RowHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index >= event->firstRow()) {
                    cell->index += newRows;
                }
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::ColumnsInserted
                   && iface->role() == QAccessible::ColumnHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index >= event->firstColumn()) {
                    cell->index += newColumns;
                }
            }
            if (indexOfChild(iface) >= 0) {
                newCache.insert(indexOfChild(iface), id);
            } else {
                // ### This should really not happen,
                // but it might if the view has a root index set.
                // This needs to be fixed.
                QAccessible::deleteAccessibleInterface(id);
            }
            ++iter;
        }
        childToId = newCache;
        break;
    }

    case QAccessibleTableModelChangeEvent::ColumnsRemoved:
    case QAccessibleTableModelChangeEvent::RowsRemoved: {
        int deletedColumns = event->lastColumn() - event->firstColumn() + 1;
        int deletedRows = event->lastRow() - event->firstRow() + 1;
        ChildCache newCache;
        ChildCache::ConstIterator iter = childToId.constBegin();
        while (iter != childToId.constEnd()) {
            QAccessible::Id id = iter.value();
            QAccessibleInterface *iface = QAccessible::accessibleInterface(id);
            Q_ASSERT(iface);
            if (iface->role() == QAccessible::Cell || iface->role() == QAccessible::ListItem) {
                Q_ASSERT(iface->tableCellInterface());
                QAccessibleTableCell *cell = static_cast<QAccessibleTableCell*>(iface->tableCellInterface());
                // Since it is a QPersistentModelIndex, we only need to check if it is valid
                if (cell->m_index.isValid())
                    newCache.insert(indexOfChild(cell), id);
                else
                    QAccessible::deleteAccessibleInterface(id);
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::RowsRemoved
                       && iface->role() == QAccessible::RowHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index < event->firstRow()) {
                    newCache.insert(indexOfChild(cell), id);
                } else if (cell->index > event->lastRow()) {
                    cell->index -= deletedRows;
                    newCache.insert(indexOfChild(cell), id);
                } else {
                    QAccessible::deleteAccessibleInterface(id);
                }
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::ColumnsRemoved
                   && iface->role() == QAccessible::ColumnHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index < event->firstColumn()) {
                    newCache.insert(indexOfChild(cell), id);
                } else if (cell->index > event->lastColumn()) {
                    cell->index -= deletedColumns;
                    newCache.insert(indexOfChild(cell), id);
                } else {
                    QAccessible::deleteAccessibleInterface(id);
                }
            }
            ++iter;
        }
        childToId = newCache;
        break;
    }

    case QAccessibleTableModelChangeEvent::DataChanged:
        // nothing to do in this case
        break;
    }
}